

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O1

double __thiscall xmrig::Hashrate::calc(Hashrate *this,size_t threadId,size_t ms)

{
  uint64_t *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar8;
  
  if (threadId < this->m_threads) {
    lVar2 = std::chrono::_V2::system_clock::now();
    puVar1 = this->m_timestamps[threadId];
    uVar7 = this->m_top[threadId] - 1 & 0xfff;
    uVar8 = (ulong)uVar7;
    uVar4 = (ulong)(uVar7 << 3);
    lVar3 = *(long *)((long)puVar1 + uVar4);
    uVar6 = uVar8;
    do {
      if (puVar1[uVar6] < lVar2 / 1000000 - ms) {
        bVar9 = puVar1[uVar6] != 0;
        if (uVar6 == uVar8) goto LAB_00159a5a;
        uVar6 = (ulong)(((int)uVar6 + 1U & 0xfff) << 3);
        lVar2 = *(long *)((long)puVar1 + uVar6);
        lVar5 = *(long *)((long)this->m_counts[threadId] + uVar6);
        goto LAB_00159a76;
      }
      uVar6 = (ulong)((int)uVar6 - 1U & 0xfff);
    } while (uVar6 != uVar8);
    bVar9 = false;
LAB_00159a5a:
    lVar2 = 0;
    lVar5 = 0;
LAB_00159a76:
    if ((((bVar9) && (lVar2 != 0)) && (lVar3 != 0)) && (lVar3 = lVar3 - lVar2, lVar3 != 0)) {
      lVar5 = *(long *)((long)this->m_counts[threadId] + uVar4) - lVar5;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar12._0_8_ = lVar3;
      auVar12._12_4_ = 0x45300000;
      return ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
             (((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 0.001);
    }
  }
  dVar10 = nan("");
  return dVar10;
}

Assistant:

double xmrig::Hashrate::calc(size_t threadId, size_t ms) const
{
    assert(threadId < m_threads);
    if (threadId >= m_threads) {
        return nan("");
    }

    uint64_t earliestHashCount = 0;
    uint64_t earliestStamp     = 0;
    bool haveFullSet           = false;

    const uint64_t timeStampLimit = xmrig::Chrono::highResolutionMSecs() - ms;
    uint64_t* timestamps = m_timestamps[threadId];
    uint64_t* counts = m_counts[threadId];

    const size_t idx_start = (m_top[threadId] - 1) & kBucketMask;
    size_t idx = idx_start;

    uint64_t lastestStamp = timestamps[idx];
    uint64_t lastestHashCnt = counts[idx];

    do {
        if (timestamps[idx] < timeStampLimit) {
            haveFullSet = (timestamps[idx] != 0);
            if (idx != idx_start) {
                idx = (idx + 1) & kBucketMask;
                earliestStamp = timestamps[idx];
                earliestHashCount = counts[idx];
            }
            break;
        }
        idx = (idx - 1) & kBucketMask;
    } while (idx != idx_start);

    if (!haveFullSet || earliestStamp == 0 || lastestStamp == 0) {
        return nan("");
    }

    if (lastestStamp - earliestStamp == 0) {
        return nan("");
    }

    const auto hashes = static_cast<double>(lastestHashCnt - earliestHashCount);
    const auto time   = static_cast<double>(lastestStamp - earliestStamp) / 1000.0;

    return hashes / time;
}